

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O3

void __thiscall CFG::addEdge(CFG *this,CfgNode *src,CfgNode *dst,unsigned_long_long count)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  CfgEdge *pCVar3;
  _Rb_tree<CfgNode*,CfgNode*,std::_Identity<CfgNode*>,std::less<CfgNode*>,std::allocator<CfgNode*>>
  *p_Var4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  CfgNode *local_40;
  CfgNode *local_38;
  CfgEdge *local_30;
  
  local_40 = dst;
  local_38 = src;
  if ((src != (CfgNode *)0x0) &&
     (p_Var2 = (this->m_nodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
     p_Var2 != (_Base_ptr)0x0)) {
    p_Var1 = &(this->m_nodes)._M_t._M_impl.super__Rb_tree_header;
    p_Var5 = &p_Var1->_M_header;
    p_Var6 = p_Var2;
    do {
      if (*(CfgNode **)(p_Var6 + 1) >= src) {
        p_Var5 = p_Var6;
      }
      p_Var6 = (&p_Var6->_M_left)[*(CfgNode **)(p_Var6 + 1) < src];
    } while (p_Var6 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var5 != p_Var1) && (*(CfgNode **)(p_Var5 + 1) <= src)) {
      p_Var6 = &p_Var1->_M_header;
      if (dst != (CfgNode *)0x0) {
        do {
          if (*(CfgNode **)(p_Var2 + 1) >= dst) {
            p_Var6 = p_Var2;
          }
          p_Var2 = (&p_Var2->_M_left)[*(CfgNode **)(p_Var2 + 1) < dst];
        } while (p_Var2 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var6 != p_Var1) && (*(CfgNode **)(p_Var6 + 1) <= dst)) {
          pCVar3 = findEdge(this,src,dst);
          if (pCVar3 == (CfgEdge *)0x0) {
            pCVar3 = (CfgEdge *)operator_new(0x20);
            CfgEdge::CfgEdge(pCVar3,src,dst,count);
            local_30 = pCVar3;
            std::
            _Rb_tree<CfgEdge*,CfgEdge*,std::_Identity<CfgEdge*>,std::less<CfgEdge*>,std::allocator<CfgEdge*>>
            ::_M_insert_unique<CfgEdge*const&>
                      ((_Rb_tree<CfgEdge*,CfgEdge*,std::_Identity<CfgEdge*>,std::less<CfgEdge*>,std::allocator<CfgEdge*>>
                        *)&this->m_edges,&local_30);
            p_Var4 = (_Rb_tree<CfgNode*,CfgNode*,std::_Identity<CfgNode*>,std::less<CfgNode*>,std::allocator<CfgNode*>>
                      *)std::
                        map<CfgNode_*,_std::set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_>,_std::less<CfgNode_*>,_std::allocator<std::pair<CfgNode_*const,_std::set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_>_>_>_>
                        ::operator[](&this->m_succs,&local_38);
            std::
            _Rb_tree<CfgNode*,CfgNode*,std::_Identity<CfgNode*>,std::less<CfgNode*>,std::allocator<CfgNode*>>
            ::_M_insert_unique<CfgNode*const&>(p_Var4,&local_40);
            p_Var4 = (_Rb_tree<CfgNode*,CfgNode*,std::_Identity<CfgNode*>,std::less<CfgNode*>,std::allocator<CfgNode*>>
                      *)std::
                        map<CfgNode_*,_std::set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_>,_std::less<CfgNode_*>,_std::allocator<std::pair<CfgNode_*const,_std::set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_>_>_>_>
                        ::operator[](&this->m_preds,&local_40);
            std::
            _Rb_tree<CfgNode*,CfgNode*,std::_Identity<CfgNode*>,std::less<CfgNode*>,std::allocator<CfgNode*>>
            ::_M_insert_unique<CfgNode*const&>(p_Var4,&local_38);
            this->m_status = UNCHECKED;
          }
          else {
            pCVar3->m_count = pCVar3->m_count + count;
          }
          return;
        }
      }
      __assert_fail("dst != 0 && this->containsNode(dst)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFG.cpp"
                    ,0x6c,"void CFG::addEdge(CfgNode *, CfgNode *, unsigned long long)");
    }
  }
  __assert_fail("src != 0 && this->containsNode(src)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFG.cpp"
                ,0x6b,"void CFG::addEdge(CfgNode *, CfgNode *, unsigned long long)");
}

Assistant:

void CFG::addEdge(CfgNode* src, CfgNode* dst, unsigned long long count) {
	assert(src != 0 && this->containsNode(src));
	assert(dst != 0 && this->containsNode(dst));

	CfgEdge* edge = this->findEdge(src, dst);
	if (edge)
		// Update edge count if already added.
		edge->updateCount(count);
	else {
		// Create and add edge.
		edge = new CfgEdge(src, dst, count);
		m_edges.insert(edge);

		m_succs[src].insert(dst);
		m_preds[dst].insert(src);

		m_status = CFG::UNCHECKED;
	}
}